

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverseNodeDependencies
          (Node *this,Reader *schemaNode,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ushort uVar1;
  ListElementCount LVar2;
  undefined2 uVar3;
  ElementCount EVar4;
  WirePointer depId;
  WirePointer depId_00;
  WirePointer depId_01;
  Reader superclass;
  StructReader local_110;
  PointerReader local_e0;
  ElementCount local_bc;
  Reader *local_b8;
  int local_ac;
  SegmentReader *local_a8;
  WirePointer *local_a0;
  CapTableReader *local_98;
  ListReader local_90;
  ListReader local_60;
  
  if ((schemaNode->_reader).dataSize < 0x70) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(undefined2 *)((long)(schemaNode->_reader).data + 0xc);
  }
  switch(uVar3) {
  case 1:
    if ((schemaNode->_reader).pointerCount < 4) {
      local_110.pointers._0_4_ = 0x7fffffff;
      local_110.capTable = (CapTableReader *)0x0;
      local_110.data = (WirePointer *)0x0;
      local_110.segment = (SegmentReader *)0x0;
    }
    else {
      local_110.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      local_110.segment = (schemaNode->_reader).segment;
      local_110.capTable = (schemaNode->_reader).capTable;
      local_110.data = (schemaNode->_reader).pointers + 3;
    }
    EVar4 = 0;
    local_b8 = schemaNode;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
    schemaNode = local_b8;
    if (local_90.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_110,&local_90,EVar4);
        if ((local_110.dataSize < 0x50) ||
           ((short)(((WirePointer *)((long)local_110.data + 8))->offsetAndKind).value == 0)) {
          if (local_110.pointerCount < 3) {
            local_e0.nestingLimit = 0x7fffffff;
            local_e0.capTable = (CapTableReader *)0x0;
            local_e0.pointer = (WirePointer *)0x0;
            local_e0.segment = (SegmentReader *)0x0;
          }
          else {
            local_e0.pointer =
                 (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 0x10);
            local_e0.capTable = local_110.capTable;
            local_e0.segment = local_110.segment;
            local_e0.nestingLimit = local_110.nestingLimit;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e0,(word *)0x0);
          traverseType(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        }
        if (local_110.pointerCount < 2) {
          local_e0.nestingLimit = 0x7fffffff;
          local_e0.capTable = (CapTableReader *)0x0;
          local_e0.pointer = (WirePointer *)0x0;
          local_e0.segment = (SegmentReader *)0x0;
        }
        else {
          local_e0.pointer =
               (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 8);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getList(&local_60,&local_e0,INLINE_COMPOSITE,(word *)0x0);
        traverseAnnotations(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        EVar4 = EVar4 + 1;
        schemaNode = local_b8;
      } while (local_90.elementCount != EVar4);
    }
    break;
  case 2:
    if ((schemaNode->_reader).pointerCount < 4) {
      local_110.pointers._0_4_ = 0x7fffffff;
      local_110.capTable = (CapTableReader *)0x0;
      local_110.data = (WirePointer *)0x0;
      local_110.segment = (SegmentReader *)0x0;
    }
    else {
      local_110.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      local_110.segment = (schemaNode->_reader).segment;
      local_110.capTable = (schemaNode->_reader).capTable;
      local_110.data = (schemaNode->_reader).pointers + 3;
    }
    EVar4 = 0;
    local_b8 = schemaNode;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
    schemaNode = local_b8;
    if (local_90.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_110,&local_90,EVar4);
        if (local_110.pointerCount < 2) {
          local_e0.nestingLimit = 0x7fffffff;
          local_e0.capTable = (CapTableReader *)0x0;
          local_e0.pointer = (WirePointer *)0x0;
          local_e0.segment = (SegmentReader *)0x0;
        }
        else {
          local_e0.pointer =
               (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 8);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getList(&local_60,&local_e0,INLINE_COMPOSITE,(word *)0x0);
        traverseAnnotations(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        EVar4 = EVar4 + 1;
        schemaNode = local_b8;
      } while (local_90.elementCount != EVar4);
    }
    break;
  case 3:
    local_a8 = (schemaNode->_reader).segment;
    local_98 = (schemaNode->_reader).capTable;
    local_a0 = (schemaNode->_reader).pointers;
    uVar1 = (schemaNode->_reader).pointerCount;
    local_ac = (schemaNode->_reader).nestingLimit;
    local_bc = CONCAT22(local_bc._2_2_,uVar1);
    if (uVar1 < 5) {
      local_110.pointers._0_4_ = 0x7fffffff;
      local_110.capTable = (CapTableReader *)0x0;
      local_110.data = (WirePointer *)0x0;
      local_110.segment = (SegmentReader *)0x0;
    }
    else {
      local_110.data = local_a0 + 4;
      local_110.capTable = local_98;
      local_110.segment = local_a8;
      local_110.pointers._0_4_ = local_ac;
    }
    EVar4 = 0;
    local_b8 = schemaNode;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
    LVar2 = local_90.elementCount;
    if (local_90.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_110,&local_90,EVar4);
        if (local_110.dataSize < 0x40) {
          depId.offsetAndKind.value = 0;
          depId.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          depId = *local_110.data;
        }
        if (depId != (WirePointer)0x0) {
          traverseDependency(this,(uint64_t)depId,eagerness,seen,finalLoader,sourceInfo,false);
        }
        if (local_110.pointerCount == 0) {
          local_e0.nestingLimit = 0x7fffffff;
          local_e0.capTable = (CapTableReader *)0x0;
          local_e0.pointer = (WirePointer *)0x0;
          local_e0.segment = (SegmentReader *)0x0;
        }
        else {
          local_e0.pointer =
               (WirePointer *)CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e0,(word *)0x0);
        traverseBrand(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        EVar4 = EVar4 + 1;
      } while (LVar2 != EVar4);
    }
    if ((ushort)local_bc < 4) {
      local_110.pointers._0_4_ = 0x7fffffff;
      local_110.capTable = (CapTableReader *)0x0;
      local_110.data = (WirePointer *)0x0;
      local_110.segment = (SegmentReader *)0x0;
    }
    else {
      local_110.data = local_a0 + 3;
      local_110.capTable = local_98;
      local_110.segment = local_a8;
      local_110.pointers._0_4_ = local_ac;
    }
    EVar4 = 0;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
    local_bc = local_90.elementCount;
    schemaNode = local_b8;
    if (local_90.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_110,&local_90,EVar4);
        if (local_110.dataSize < 0x80) {
          depId_00.offsetAndKind.value = 0;
          depId_00.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          depId_00 = *(WirePointer *)((long)local_110.data + 8);
        }
        traverseDependency(this,(uint64_t)depId_00,eagerness,seen,finalLoader,sourceInfo,true);
        if (local_110.pointerCount < 3) {
          local_e0.nestingLimit = 0x7fffffff;
          local_e0.capTable = (CapTableReader *)0x0;
          local_e0.pointer = (WirePointer *)0x0;
          local_e0.segment = (SegmentReader *)0x0;
        }
        else {
          local_e0.pointer =
               (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 0x10);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e0,(word *)0x0);
        traverseBrand(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        depId_01.offsetAndKind.value = 0;
        depId_01.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if (0xbf < local_110.dataSize) {
          depId_01 = *(WirePointer *)((long)local_110.data + 0x10);
        }
        traverseDependency(this,(uint64_t)depId_01,eagerness,seen,finalLoader,sourceInfo,true);
        if (local_110.pointerCount < 4) {
          local_e0.capTable = (CapTableReader *)0x0;
          local_e0.pointer = (WirePointer *)0x0;
          local_e0.segment = (SegmentReader *)0x0;
          local_e0.nestingLimit = 0x7fffffff;
        }
        else {
          local_e0.pointer =
               (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 0x18);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e0,(word *)0x0);
        traverseBrand(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        local_e0.pointer = (WirePointer *)0x0;
        local_e0.capTable = (CapTableReader *)0x0;
        local_e0.segment = (SegmentReader *)0x0;
        local_e0.nestingLimit = 0x7fffffff;
        if (1 < local_110.pointerCount) {
          local_e0.pointer =
               (WirePointer *)(CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers) + 8);
          local_e0.capTable = local_110.capTable;
          local_e0.segment = local_110.segment;
          local_e0.nestingLimit = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getList(&local_60,&local_e0,INLINE_COMPOSITE,(word *)0x0);
        traverseAnnotations(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
        EVar4 = EVar4 + 1;
        schemaNode = local_b8;
      } while (local_bc != EVar4);
    }
    break;
  case 4:
  case 5:
    if ((schemaNode->_reader).pointerCount < 4) {
      local_110.pointers._0_4_ = 0x7fffffff;
      local_110.capTable = (CapTableReader *)0x0;
      local_110.data = (WirePointer *)0x0;
      local_110.segment = (SegmentReader *)0x0;
    }
    else {
      local_110.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      local_110.segment = (schemaNode->_reader).segment;
      local_110.capTable = (schemaNode->_reader).capTable;
      local_110.data = (schemaNode->_reader).pointers + 3;
    }
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_90,(PointerReader *)&local_110,(word *)0x0);
    traverseType(this,(Reader *)&local_90,eagerness,seen,finalLoader,sourceInfo);
  }
  if ((schemaNode->_reader).pointerCount < 3) {
    local_110.pointers._0_4_ = 0x7fffffff;
    local_110.capTable = (CapTableReader *)0x0;
    local_110.data = (WirePointer *)0x0;
    local_110.segment = (SegmentReader *)0x0;
  }
  else {
    local_110.segment = (schemaNode->_reader).segment;
    local_110.capTable = (schemaNode->_reader).capTable;
    local_110.data = (schemaNode->_reader).pointers + 2;
    local_110.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
  traverseAnnotations(this,(Reader *)&local_90,eagerness,seen,finalLoader,sourceInfo);
  return;
}

Assistant:

void Compiler::Node::traverseNodeDependencies(
    const schema::Node::Reader& schemaNode, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  switch (schemaNode.which()) {
    case schema::Node::STRUCT:
      for (auto field: schemaNode.getStruct().getFields()) {
        switch (field.which()) {
          case schema::Field::SLOT:
            traverseType(field.getSlot().getType(), eagerness, seen, finalLoader, sourceInfo);
            break;
          case schema::Field::GROUP:
            // Aux node will be scanned later.
            break;
        }

        traverseAnnotations(field.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::ENUM:
      for (auto enumerant: schemaNode.getEnum().getEnumerants()) {
        traverseAnnotations(enumerant.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::INTERFACE: {
      auto interface = schemaNode.getInterface();
      for (auto superclass: interface.getSuperclasses()) {
        uint64_t superclassId = superclass.getId();
        if (superclassId != 0) {  // if zero, we reported an error earlier
          traverseDependency(superclassId, eagerness, seen, finalLoader, sourceInfo);
        }
        traverseBrand(superclass.getBrand(), eagerness, seen, finalLoader, sourceInfo);
      }
      for (auto method: interface.getMethods()) {
        traverseDependency(
            method.getParamStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getParamBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseDependency(
            method.getResultStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getResultBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseAnnotations(method.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;
    }

    case schema::Node::CONST:
      traverseType(schemaNode.getConst().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    case schema::Node::ANNOTATION:
      traverseType(schemaNode.getAnnotation().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    default:
      break;
  }

  traverseAnnotations(schemaNode.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
}